

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O2

ostream * operator<<(ostream *ostream,SSLSocket *SSLSocket)

{
  string local_30 [32];
  
  (*(SSLSocket->super_Socket).super_stream._vptr_stream[1])(local_30);
  std::operator<<(ostream,local_30);
  std::__cxx11::string::~string(local_30);
  return ostream;
}

Assistant:

std::ostream &operator<<(std::ostream &ostream, blc::network::SSLSocket &SSLSocket) {
	ostream << SSLSocket.read();
	return (ostream);
}